

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall
Js::StepController::HandleResumeAction
          (StepController *this,InterpreterHaltState *haltState,BREAKRESUMEACTION resumeAction)

{
  BREAKRESUMEACTION resumeAction_local;
  InterpreterHaltState *haltState_local;
  StepController *this_local;
  
  ResetReturnedValueList(this);
  switch(resumeAction) {
  case BREAKRESUMEACTION_STEP_INTO:
    Activate(this,STEP_IN,haltState);
    break;
  case BREAKRESUMEACTION_STEP_OVER:
    Activate(this,STEP_OVER,haltState);
    break;
  case BREAKRESUMEACTION_STEP_OUT:
    Activate(this,STEP_OUT,haltState);
    break;
  case BREAKRESUMEACTION_STEP_DOCUMENT:
    Activate(this,STEP_DOCUMENT,haltState);
  }
  return;
}

Assistant:

void StepController::HandleResumeAction(Js::InterpreterHaltState* haltState, BREAKRESUMEACTION resumeAction)
    {
        ResetReturnedValueList();
        switch (resumeAction)
        {
        case BREAKRESUMEACTION_STEP_INTO:
            Activate(Js::STEP_IN, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OVER:
            Activate(Js::STEP_OVER, haltState);
            break;
        case BREAKRESUMEACTION_STEP_OUT:
            Activate(Js::STEP_OUT, haltState);
            break;
        case BREAKRESUMEACTION_STEP_DOCUMENT:
            Activate(Js::STEP_DOCUMENT, haltState);
            break;
        }
    }